

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_init_finish.c
# Opt level: O0

int dwarf_get_section_info_by_index_a
              (Dwarf_Debug dbg,int section_index,char **section_name,Dwarf_Addr *section_addr,
              Dwarf_Unsigned *section_size,Dwarf_Unsigned *section_flags,
              Dwarf_Unsigned *section_offset,Dwarf_Error *error)

{
  Dwarf_Obj_Access_Interface_a_s *pDVar1;
  Dwarf_Unsigned DVar2;
  Dwarf_Obj_Access_Interface_a_s *obj;
  Dwarf_Obj_Access_Section_a_s doas;
  int err;
  int res;
  Dwarf_Unsigned sectioncount;
  Dwarf_Unsigned *section_flags_local;
  Dwarf_Unsigned *section_size_local;
  Dwarf_Addr *section_addr_local;
  char **section_name_local;
  int section_index_local;
  Dwarf_Debug dbg_local;
  
  if ((dbg == (Dwarf_Debug)0x0) || (dbg->de_magic != 0xebfdebfd)) {
    _dwarf_error_string((Dwarf_Debug)0x0,error,0x51,
                        "DW_DLE_DBG_NULL: dbg argument to dwarf_get_section_info_by_index_a()either null or it containsa stale Dwarf_Debug pointer"
                       );
    dbg_local._4_4_ = 1;
  }
  else {
    DVar2 = dwarf_get_section_count(dbg);
    if (section_addr != (Dwarf_Addr *)0x0) {
      *section_addr = 0;
    }
    if (section_size != (Dwarf_Unsigned *)0x0) {
      *section_size = 0;
    }
    if (section_name != (char **)0x0) {
      *section_name = (char *)0x0;
    }
    if (section_flags != (Dwarf_Unsigned *)0x0) {
      *section_flags = 0;
    }
    if (section_offset != (Dwarf_Unsigned *)0x0) {
      *section_offset = 0;
    }
    if (section_index < 0) {
      dbg_local._4_4_ = -1;
    }
    else if ((ulong)(long)section_index < DVar2) {
      doas.as_entrysize._4_4_ = 0;
      doas.as_entrysize._0_4_ = 0;
      pDVar1 = dbg->de_obj_file;
      if (pDVar1 == (Dwarf_Obj_Access_Interface_a_s *)0x0) {
        dbg_local._4_4_ = -1;
      }
      else {
        doas.as_entrysize._4_4_ =
             (*pDVar1->ai_methods->om_get_section_info)
                       (pDVar1->ai_object,(long)section_index,(Dwarf_Obj_Access_Section_a *)&obj,
                        (int *)&doas.as_entrysize);
        if (doas.as_entrysize._4_4_ == 1) {
          _dwarf_error(dbg,error,(long)(int)doas.as_entrysize);
          dbg_local._4_4_ = 1;
        }
        else {
          if (section_addr != (Dwarf_Addr *)0x0) {
            *section_addr = doas.as_flags;
          }
          if (section_size != (Dwarf_Unsigned *)0x0) {
            *section_size = doas.as_offset;
          }
          if (section_name != (char **)0x0) {
            *section_name = (char *)obj;
          }
          if (section_flags != (Dwarf_Unsigned *)0x0) {
            *section_flags = doas.as_type;
          }
          if (section_offset != (Dwarf_Unsigned *)0x0) {
            *section_offset = doas.as_addr;
          }
          dbg_local._4_4_ = 0;
        }
      }
    }
    else {
      dbg_local._4_4_ = -1;
    }
  }
  return dbg_local._4_4_;
}

Assistant:

int
dwarf_get_section_info_by_index_a(Dwarf_Debug dbg,
    int section_index,
    const char **section_name,
    Dwarf_Addr *section_addr,
    Dwarf_Unsigned *section_size,
    Dwarf_Unsigned *section_flags,
    Dwarf_Unsigned *section_offset,
    Dwarf_Error * error)
{
    Dwarf_Unsigned sectioncount = 0;
    CHECK_DBG(dbg,error,"dwarf_get_section_info_by_index_a()");

    sectioncount = dwarf_get_section_count(dbg);

    if (section_addr) {
        *section_addr = 0;
    }
    if (section_size) {
        *section_size = 0;
    }
    if (section_name) {
        *section_name = 0;
    }
    if (section_flags) {
        *section_flags = 0;
    }
    if (section_offset) {
        *section_offset = 0;
    }
    if (section_index < 0) {
        return DW_DLV_NO_ENTRY;
    }
    /* Check if we have a valid section index */
    if ((Dwarf_Unsigned)section_index < sectioncount){
        int res = 0;
        int err = 0;
        struct Dwarf_Obj_Access_Section_a_s doas;
        struct Dwarf_Obj_Access_Interface_a_s * obj =
            dbg->de_obj_file;
        if (NULL == obj) {
            return DW_DLV_NO_ENTRY;
        }
        res = obj->ai_methods->om_get_section_info(obj->ai_object,
            section_index, &doas, &err);
        if (res == DW_DLV_ERROR){
            DWARF_DBG_ERROR(dbg, err, DW_DLV_ERROR);
        }

        if (section_addr) {
            *section_addr = doas.as_addr;
        }
        if (section_size) {
            *section_size = doas.as_size;
        }
        if (section_name) {
            *section_name = doas.as_name;
        }
        if (section_flags) {
            *section_flags = doas.as_flags;
        }
        if (section_offset) {
            *section_offset = doas.as_offset;
        }
        return DW_DLV_OK;
    }
    return DW_DLV_NO_ENTRY;
}